

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

Test * BuildTestPhonySelfReference::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x460);
  BuildTestPhonySelfReference((BuildTestPhonySelfReference *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(BuildTest, PhonySelfReference) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a: phony a\n"));

  EXPECT_TRUE(builder_.AddTarget("a", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}